

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void __thiscall Rml::XMLParser::~XMLParser(XMLParser *this)

{
  XMLParser *this_local;
  
  ~XMLParser(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

XMLParser::~XMLParser() {}